

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O2

void __thiscall
helics::BaseTimeCoordinator::processDependencyUpdateMessage
          (BaseTimeCoordinator *this,ActionMessage *cmd)

{
  ushort uVar1;
  char cVar2;
  int iVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar4;
  
  switch(cmd->messageAction) {
  case cmd_add_dependency:
    iVar3 = (*this->_vptr_BaseTimeCoordinator[4])(this,(ulong)(uint)(cmd->source_id).gid);
    cVar2 = (char)iVar3;
    goto joined_r0x002a24f0;
  case cmd_remove_dependency:
    uVar4 = (ulong)(uint)(cmd->source_id).gid;
    UNRECOVERED_JUMPTABLE = this->_vptr_BaseTimeCoordinator[6];
    break;
  case cmd_add_dependency|cmd_user_disconnect:
  case cmd_add_dependency|cmd_disconnect:
  case cmd_add_dependent|cmd_user_disconnect:
  case cmd_add_dependent|cmd_disconnect:
    goto switchD_002a245b_caseD_8e;
  case cmd_add_dependent:
    uVar4 = (ulong)(uint)(cmd->source_id).gid;
    UNRECOVERED_JUMPTABLE = this->_vptr_BaseTimeCoordinator[5];
    break;
  case cmd_add_interdependency:
    iVar3 = (*this->_vptr_BaseTimeCoordinator[4])(this,(ulong)(uint)(cmd->source_id).gid);
    (*this->_vptr_BaseTimeCoordinator[5])(this,(ulong)(uint)(cmd->source_id).gid);
    cVar2 = (char)iVar3;
joined_r0x002a24f0:
    if (cVar2 != '\0') {
      uVar1 = cmd->flags;
      if ((uVar1 >> 0xe & 1) != 0) {
        setAsChild(this,(GlobalFederateId)(cmd->source_id).gid);
        uVar1 = cmd->flags;
      }
      if ((uVar1 >> 0xd & 1) != 0) {
        setAsParent(this,(GlobalFederateId)(cmd->source_id).gid);
      }
      if (cmd->counter != 0) {
        setVersion(this,(GlobalFederateId)(cmd->source_id).gid,(int8_t)cmd->counter);
        return;
      }
    }
switchD_002a245b_caseD_8e:
    return;
  case cmd_remove_interdependency:
    (*this->_vptr_BaseTimeCoordinator[6])(this,(ulong)(uint)(cmd->source_id).gid);
  case cmd_remove_dependent:
    uVar4 = (ulong)(uint)(cmd->source_id).gid;
    UNRECOVERED_JUMPTABLE = this->_vptr_BaseTimeCoordinator[7];
    break;
  default:
    if (cmd->messageAction == cmd_timing_info) {
      TimeDependencies::updateTime(&this->dependencies,cmd);
      return;
    }
    goto switchD_002a245b_caseD_8e;
  }
  (*UNRECOVERED_JUMPTABLE)(this,uVar4);
  return;
}

Assistant:

void BaseTimeCoordinator::processDependencyUpdateMessage(const ActionMessage& cmd)
{
    bool added{false};
    switch (cmd.action()) {
        case CMD_ADD_DEPENDENCY:
            added = addDependency(cmd.source_id);
            break;
        case CMD_REMOVE_DEPENDENCY:
            removeDependency(cmd.source_id);
            break;
        case CMD_ADD_DEPENDENT:
            addDependent(cmd.source_id);
            break;
        case CMD_REMOVE_DEPENDENT:
            removeDependent(cmd.source_id);
            break;
        case CMD_ADD_INTERDEPENDENCY:
            added = addDependency(cmd.source_id);
            addDependent(cmd.source_id);
            break;
        case CMD_REMOVE_INTERDEPENDENCY:
            removeDependency(cmd.source_id);
            removeDependent(cmd.source_id);
            break;
        case CMD_TIMING_INFO:
            dependencies.updateTime(cmd);
            break;
        default:
            break;
    }
    if (added) {
        if (checkActionFlag(cmd, child_flag)) {
            setAsChild(cmd.source_id);
        }
        if (checkActionFlag(cmd, parent_flag)) {
            setAsParent(cmd.source_id);
        }
        if (cmd.counter > 0) {
            setVersion(cmd.source_id, cmd.counter);
        }
    }
}